

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  char cVar28;
  bool bVar29;
  int iVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  undefined4 uVar32;
  RTCIntersectArguments *pRVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong *puVar37;
  long lVar38;
  NodeRef root;
  undefined1 (*pauVar39) [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar52 [16];
  float fVar51;
  float fVar66;
  undefined1 auVar53 [16];
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar54 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar81;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar78 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float in_register_0000131c;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  undefined1 auVar108 [16];
  float fVar107;
  float fVar113;
  float fVar115;
  undefined1 auVar109 [16];
  float fVar112;
  float fVar114;
  float fVar116;
  float in_register_0000135c;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar123 [16];
  undefined1 auVar120 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vfloat4 a0;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar141 [64];
  undefined1 in_ZMM15 [64];
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  vbool<8> valid_o;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5d20 [20];
  uint uStack_5d0c;
  uint uStack_5d08;
  uint uStack_5d04;
  BVH *local_5cf0;
  RayK<8> *local_5ce8;
  undefined1 local_5ce0 [16];
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5cc0 [8];
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  undefined1 local_5ca0 [8];
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined1 local_5c80 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c60;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  float fStack_5ba4;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [2] [32];
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  float fStack_5a04;
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  float fStack_59e4;
  float local_59e0;
  float fStack_59dc;
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  float fStack_59c4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  RTCIntersectArguments local_59a0;
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar89 [28];
  undefined1 auVar96 [64];
  
  local_5cf0 = (BVH *)This->ptr;
  sVar1 = (local_5cf0->root).ptr;
  if (sVar1 != 8) {
    auVar44 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar44,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar44 = vpcmpeqd_avx(auVar44,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar77 = *(undefined1 (*) [32])(ray + 0x100);
    auVar94 = vcmpps_avx(auVar77,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar55._16_16_ = auVar44;
    auVar55._0_16_ = auVar72;
    local_5aa0 = vandps_avx(auVar94,auVar55);
    uVar34 = vmovmskps_avx(local_5aa0);
    if (uVar34 != 0) {
      local_5ce8 = ray + 0x100;
      pRVar33 = &local_59a0;
      _local_5c00 = *(undefined1 (*) [32])(ray + 0x80);
      _local_5be0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5bc0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar101._0_4_ =
           local_5c00._0_4_ * local_5c00._0_4_ +
           local_5bc0._0_4_ * local_5bc0._0_4_ + local_5be0._0_4_ * local_5be0._0_4_;
      auVar101._4_4_ =
           local_5c00._4_4_ * local_5c00._4_4_ +
           local_5bc0._4_4_ * local_5bc0._4_4_ + local_5be0._4_4_ * local_5be0._4_4_;
      auVar101._8_4_ =
           local_5c00._8_4_ * local_5c00._8_4_ +
           local_5bc0._8_4_ * local_5bc0._8_4_ + local_5be0._8_4_ * local_5be0._8_4_;
      auVar101._12_4_ =
           local_5c00._12_4_ * local_5c00._12_4_ +
           local_5bc0._12_4_ * local_5bc0._12_4_ + local_5be0._12_4_ * local_5be0._12_4_;
      auVar101._16_4_ =
           local_5c00._16_4_ * local_5c00._16_4_ +
           local_5bc0._16_4_ * local_5bc0._16_4_ + local_5be0._16_4_ * local_5be0._16_4_;
      auVar101._20_4_ =
           local_5c00._20_4_ * local_5c00._20_4_ +
           local_5bc0._20_4_ * local_5bc0._20_4_ + local_5be0._20_4_ * local_5be0._20_4_;
      auVar101._24_4_ =
           local_5c00._24_4_ * local_5c00._24_4_ +
           local_5bc0._24_4_ * local_5bc0._24_4_ + local_5be0._24_4_ * local_5be0._24_4_;
      auVar101._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar94 = vrsqrtps_avx(auVar101);
      uVar35 = (ulong)(uVar34 & 0xff);
      fVar106 = auVar94._0_4_;
      fVar112 = auVar94._4_4_;
      fVar114 = auVar94._8_4_;
      fVar116 = auVar94._12_4_;
      fVar70 = auVar94._16_4_;
      fVar79 = auVar94._20_4_;
      fVar80 = auVar94._24_4_;
      local_59c0.v[0] = fVar106 * 1.5 + fVar106 * fVar106 * fVar106 * auVar101._0_4_ * -0.5;
      local_59c0.v[1] = fVar112 * 1.5 + fVar112 * fVar112 * fVar112 * auVar101._4_4_ * -0.5;
      local_59c0.v[2] = fVar114 * 1.5 + fVar114 * fVar114 * fVar114 * auVar101._8_4_ * -0.5;
      local_59c0.v[3] = fVar116 * 1.5 + fVar116 * fVar116 * fVar116 * auVar101._12_4_ * -0.5;
      local_59c0.v[4] = fVar70 * 1.5 + fVar70 * fVar70 * fVar70 * auVar101._16_4_ * -0.5;
      local_59c0.v[5] = fVar79 * 1.5 + fVar79 * fVar79 * fVar79 * auVar101._20_4_ * -0.5;
      local_59c0.v[6] = fVar80 * 1.5 + fVar80 * fVar80 * fVar80 * auVar101._24_4_ * -0.5;
      local_59c0.v[7] = auVar101._28_4_ + 1.5;
      auVar44._8_4_ = 0x80000000;
      auVar44._0_8_ = 0x8000000080000000;
      auVar44._12_4_ = 0x80000000;
      auVar72 = ZEXT816(0) << 0x20;
      do {
        lVar38 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
          }
        }
        auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar38 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar38 * 4 + 0xa0)),0x1c);
        auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + lVar38 * 4 + 0xc0)),0x28);
        fVar106 = *(float *)((long)&local_59c0 + lVar38 * 4);
        auVar123._0_4_ = auVar54._0_4_ * fVar106;
        auVar123._4_4_ = auVar54._4_4_ * fVar106;
        auVar123._8_4_ = auVar54._8_4_ * fVar106;
        auVar123._12_4_ = auVar54._12_4_ * fVar106;
        auVar137 = vshufpd_avx(auVar123,auVar123,1);
        auVar54 = vmovshdup_avx(auVar123);
        auVar134 = vunpckhps_avx(auVar123,auVar72);
        auVar136._8_8_ = 0;
        auVar136._0_8_ = (ulong)auVar54._0_4_ ^ 0x80000000;
        auVar97 = vshufps_avx(auVar134,auVar136,0x41);
        auVar134._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
        auVar134._8_8_ = auVar137._8_8_ ^ auVar44._8_8_;
        auVar134 = vinsertps_avx(auVar134,auVar123,0x2a);
        auVar54 = vdpps_avx(auVar97,auVar97,0x7f);
        auVar137 = vdpps_avx(auVar134,auVar134,0x7f);
        auVar54 = vcmpps_avx(auVar137,auVar54,1);
        auVar54 = vshufps_avx(auVar54,auVar54,0);
        auVar54 = vblendvps_avx(auVar134,auVar97,auVar54);
        auVar137 = vdpps_avx(auVar54,auVar54,0x7f);
        auVar134 = vrsqrtss_avx(auVar137,auVar137);
        fVar112 = auVar134._0_4_;
        auVar137 = ZEXT416((uint)(fVar112 * 1.5 - auVar137._0_4_ * 0.5 * fVar112 * fVar112 * fVar112
                                 ));
        auVar137 = vshufps_avx(auVar137,auVar137,0);
        auVar97._0_4_ = auVar54._0_4_ * auVar137._0_4_;
        auVar97._4_4_ = auVar54._4_4_ * auVar137._4_4_;
        auVar97._8_4_ = auVar54._8_4_ * auVar137._8_4_;
        auVar97._12_4_ = auVar54._12_4_ * auVar137._12_4_;
        auVar54 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar137 = vshufps_avx(auVar123,auVar123,0xc9);
        auVar139._0_4_ = auVar137._0_4_ * auVar97._0_4_;
        auVar139._4_4_ = auVar137._4_4_ * auVar97._4_4_;
        auVar139._8_4_ = auVar137._8_4_ * auVar97._8_4_;
        auVar139._12_4_ = auVar137._12_4_ * auVar97._12_4_;
        auVar137._0_4_ = auVar123._0_4_ * auVar54._0_4_;
        auVar137._4_4_ = auVar123._4_4_ * auVar54._4_4_;
        auVar137._8_4_ = auVar123._8_4_ * auVar54._8_4_;
        auVar137._12_4_ = auVar123._12_4_ * auVar54._12_4_;
        auVar54 = vsubps_avx(auVar137,auVar139);
        auVar134 = vshufps_avx(auVar54,auVar54,0xc9);
        auVar54 = vdpps_avx(auVar134,auVar134,0x7f);
        lVar38 = lVar38 * 0x30;
        auVar137 = vrsqrtss_avx(auVar54,auVar54);
        fVar112 = auVar137._0_4_;
        auVar141 = ZEXT464((uint)(fVar112 * 1.5));
        auVar54 = ZEXT416((uint)(fVar112 * 1.5 - auVar54._0_4_ * 0.5 * fVar112 * fVar112 * fVar112))
        ;
        auVar54 = vshufps_avx(auVar54,auVar54,0);
        auVar138._0_4_ = auVar54._0_4_ * auVar134._0_4_;
        auVar138._4_4_ = auVar54._4_4_ * auVar134._4_4_;
        auVar138._8_4_ = auVar54._8_4_ * auVar134._8_4_;
        auVar138._12_4_ = auVar54._12_4_ * auVar134._12_4_;
        auVar54._0_4_ = fVar106 * auVar123._0_4_;
        auVar54._4_4_ = fVar106 * auVar123._4_4_;
        auVar54._8_4_ = fVar106 * auVar123._8_4_;
        auVar54._12_4_ = fVar106 * auVar123._12_4_;
        auVar134 = vunpcklps_avx(auVar97,auVar54);
        auVar54 = vunpckhps_avx(auVar97,auVar54);
        auVar97 = vunpcklps_avx(auVar138,auVar72);
        auVar137 = vunpckhps_avx(auVar138,auVar72);
        auVar137 = vunpcklps_avx(auVar54,auVar137);
        auVar123 = vunpcklps_avx(auVar134,auVar97);
        auVar54 = vunpckhps_avx(auVar134,auVar97);
        ((RayQueryContext *)((long)pRVar33 + lVar38))->scene = (Scene *)auVar123._0_8_;
        ((RayQueryContext *)((long)pRVar33 + lVar38))->user = (RTCRayQueryContext *)auVar123._8_8_;
        *(undefined1 (*) [16])(auStack_5980 + lVar38 + -0x10) = auVar54;
        *(undefined1 (*) [16])(auStack_5980 + lVar38) = auVar137;
        uVar35 = uVar35 & uVar35 - 1;
      } while (uVar35 != 0);
      local_5c60._0_4_ = (undefined4)*(undefined8 *)ray;
      local_5c60._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      local_5c60._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      local_5c60._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_5c60._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      local_5c60._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      local_5c60._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      local_5c60._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_5c60._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      local_5c60._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      local_5c60._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      local_5c60._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_5c60._48_4_ = (undefined4)*(undefined8 *)(ray + 0x30);
      local_5c60._52_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      local_5c60._56_4_ = (undefined4)*(undefined8 *)(ray + 0x38);
      local_5c60._60_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_5c60._64_4_ = (undefined4)*(undefined8 *)(ray + 0x40);
      local_5c60._68_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      local_5c60._72_4_ = (undefined4)*(undefined8 *)(ray + 0x48);
      local_5c60._76_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      local_5c60._80_4_ = (undefined4)*(undefined8 *)(ray + 0x50);
      local_5c60._84_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      local_5c60._88_4_ = (undefined4)*(undefined8 *)(ray + 0x58);
      local_5c60._92_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar118._8_4_ = 0x7fffffff;
      auVar118._0_8_ = 0x7fffffff7fffffff;
      auVar118._12_4_ = 0x7fffffff;
      auVar118._16_4_ = 0x7fffffff;
      auVar118._20_4_ = 0x7fffffff;
      auVar118._24_4_ = 0x7fffffff;
      auVar118._28_4_ = 0x7fffffff;
      auVar129._8_4_ = 0x219392ef;
      auVar129._0_8_ = 0x219392ef219392ef;
      auVar129._12_4_ = 0x219392ef;
      auVar129._16_4_ = 0x219392ef;
      auVar129._20_4_ = 0x219392ef;
      auVar129._24_4_ = 0x219392ef;
      auVar129._28_4_ = 0x219392ef;
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = 0x3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar132._16_4_ = 0x3f800000;
      auVar132._20_4_ = 0x3f800000;
      auVar132._24_4_ = 0x3f800000;
      auVar132._28_4_ = 0x3f800000;
      auVar90 = vdivps_avx(auVar132,_local_5c00);
      auVar94 = vandps_avx(_local_5c00,auVar118);
      auVar55 = vcmpps_avx(auVar94,auVar129,1);
      auVar94 = vandps_avx(_local_5be0,auVar118);
      auVar101 = vcmpps_avx(auVar94,auVar129,1);
      auVar91 = vdivps_avx(auVar132,_local_5be0);
      auVar94 = vandps_avx(_local_5bc0,auVar118);
      auVar126._8_4_ = 0x5d5e0b6b;
      auVar126._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar126._12_4_ = 0x5d5e0b6b;
      auVar126._16_4_ = 0x5d5e0b6b;
      auVar126._20_4_ = 0x5d5e0b6b;
      auVar126._24_4_ = 0x5d5e0b6b;
      auVar126._28_4_ = 0x5d5e0b6b;
      _local_5ba0 = vblendvps_avx(auVar90,auVar126,auVar55);
      auVar94 = vcmpps_avx(auVar94,auVar129,1);
      auVar55 = vdivps_avx(auVar132,_local_5bc0);
      _local_5b80 = vblendvps_avx(auVar91,auVar126,auVar101);
      _local_5b60 = vblendvps_avx(auVar55,auVar126,auVar94);
      auVar94 = vcmpps_avx(_local_5ba0,ZEXT832(0) << 0x20,1);
      auVar90._8_4_ = 0x20;
      auVar90._0_8_ = 0x2000000020;
      auVar90._12_4_ = 0x20;
      auVar90._16_4_ = 0x20;
      auVar90._20_4_ = 0x20;
      auVar90._24_4_ = 0x20;
      auVar90._28_4_ = 0x20;
      local_5b40 = vandps_avx(auVar94,auVar90);
      auVar94 = vcmpps_avx(_local_5b80,ZEXT832(0) << 0x20,5);
      auVar91._8_4_ = 0x40;
      auVar91._0_8_ = 0x4000000040;
      auVar91._12_4_ = 0x40;
      auVar91._16_4_ = 0x40;
      auVar91._20_4_ = 0x40;
      auVar91._24_4_ = 0x40;
      auVar91._28_4_ = 0x40;
      auVar110._8_4_ = 0x60;
      auVar110._0_8_ = 0x6000000060;
      auVar110._12_4_ = 0x60;
      auVar110._16_4_ = 0x60;
      auVar110._20_4_ = 0x60;
      auVar110._24_4_ = 0x60;
      auVar110._28_4_ = 0x60;
      local_5b20 = vblendvps_avx(auVar110,auVar91,auVar94);
      auVar55 = ZEXT832(0) << 0x20;
      auVar94 = vcmpps_avx(_local_5b60,auVar55,5);
      auVar92._8_4_ = 0x80;
      auVar92._0_8_ = 0x8000000080;
      auVar92._12_4_ = 0x80;
      auVar92._16_4_ = 0x80;
      auVar92._20_4_ = 0x80;
      auVar92._24_4_ = 0x80;
      auVar92._28_4_ = 0x80;
      auVar102._8_4_ = 0xa0;
      auVar102._0_8_ = 0xa0000000a0;
      auVar102._12_4_ = 0xa0;
      auVar102._16_4_ = 0xa0;
      auVar102._20_4_ = 0xa0;
      auVar102._24_4_ = 0xa0;
      auVar102._28_4_ = 0xa0;
      local_5b00 = vblendvps_avx(auVar102,auVar92,auVar94);
      auVar94 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar55);
      auVar93._8_4_ = 0x7f800000;
      auVar93._0_8_ = 0x7f8000007f800000;
      auVar93._12_4_ = 0x7f800000;
      auVar93._16_4_ = 0x7f800000;
      auVar93._20_4_ = 0x7f800000;
      auVar93._24_4_ = 0x7f800000;
      auVar93._28_4_ = 0x7f800000;
      auVar78 = ZEXT3264(local_5aa0);
      local_5ae0 = vblendvps_avx(auVar93,auVar94,local_5aa0);
      auVar77 = vmaxps_avx(auVar77,auVar55);
      auVar94._8_4_ = 0xff800000;
      auVar94._0_8_ = 0xff800000ff800000;
      auVar94._12_4_ = 0xff800000;
      auVar94._16_4_ = 0xff800000;
      auVar94._20_4_ = 0xff800000;
      auVar94._24_4_ = 0xff800000;
      auVar94._28_4_ = 0xff800000;
      auVar96 = ZEXT3264(auVar94);
      local_5ac0 = vblendvps_avx(auVar94,auVar77,local_5aa0);
      auVar77 = vcmpps_avx(local_5ac0,local_5ac0,0xf);
      local_5d20._4_4_ = local_5aa0._4_4_ ^ auVar77._4_4_;
      local_5d20._0_4_ = local_5aa0._0_4_ ^ auVar77._0_4_;
      local_5d20._8_4_ = local_5aa0._8_4_ ^ auVar77._8_4_;
      local_5d20._12_4_ = local_5aa0._12_4_ ^ auVar77._12_4_;
      local_5d20._16_4_ = local_5aa0._16_4_ ^ auVar77._16_4_;
      uStack_5d0c = local_5aa0._20_4_ ^ auVar77._20_4_;
      uStack_5d08 = local_5aa0._24_4_ ^ auVar77._24_4_;
      uStack_5d04 = local_5aa0._28_4_ ^ auVar77._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 7;
      }
      else {
        pRVar33 = context->args;
        uVar35 = (ulong)(((ulong)*(Scene **)&pRVar33->flags & 0x10000) == 0) * 5 + 2;
      }
      puVar37 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar39 = (undefined1 (*) [32])local_4640;
      local_4680 = 0x7f800000;
      uStack_467c = 0x7f800000;
      uStack_4678 = 0x7f800000;
      uStack_4674 = 0x7f800000;
      uStack_4670 = 0x7f800000;
      uStack_466c = 0x7f800000;
      uStack_4668 = 0x7f800000;
      uStack_4664 = 0x7f800000;
      local_5808 = sVar1;
      local_4660 = local_5ae0;
      local_5a80[1]._0_8_ = mm_lookupmask_ps._16_8_;
      local_5a80[1]._8_8_ = mm_lookupmask_ps._24_8_;
      local_5a80[1]._16_8_ = mm_lookupmask_ps._16_8_;
      local_5a80[1]._24_8_ = mm_lookupmask_ps._24_8_;
LAB_0043ee53:
      do {
        do {
          auVar44 = auVar78._0_16_;
          root.ptr = puVar37[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0043f82e;
          puVar37 = puVar37 + -1;
          pauVar39 = pauVar39 + -1;
          auVar77 = *pauVar39;
          auVar63 = ZEXT3264(auVar77);
          auVar94 = vcmpps_avx(auVar77,local_5ac0,1);
        } while ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar94 >> 0x7f,0) == '\0') &&
                   (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar94 >> 0xbf,0) == '\0') &&
                 (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar94[0x1f]);
        uVar32 = vmovmskps_avx(auVar94);
        pRVar33 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar32);
        if (uVar35 < CONCAT44(0,POPCOUNT(uVar32))) {
LAB_0043ee90:
          do {
            iVar30 = 4;
            lVar38 = -0x20;
            uVar36 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0043f82e;
              auVar77 = vcmpps_avx(local_5ac0,auVar63._0_32_,6);
              if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar77 >> 0x7f,0) != '\0') ||
                    (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0xbf,0) != '\0') ||
                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar77[0x1f] < '\0') {
                pRVar33 = (RTCIntersectArguments *)This->leafIntersector;
                auVar73._8_8_ = local_5a80[1]._8_8_;
                auVar73._0_8_ = local_5a80[1]._0_8_;
                local_5a80[0]._16_8_ = local_5a80[1]._16_8_;
                local_5a80[0]._0_16_ = auVar73;
                local_5a80[0]._24_8_ = local_5a80[1]._24_8_;
                auVar78 = ZEXT3264(local_5a80[0]);
                auVar44 = vpcmpeqd_avx(auVar96._0_16_,auVar96._0_16_);
                auVar96 = ZEXT1664(auVar44);
                auVar72 = vpcmpgtd_avx(stack0xffffffffffffa2f0,auVar44);
                auVar44 = vpcmpgtd_avx(local_5d20._0_16_,auVar44);
                auVar50._16_16_ = auVar72;
                auVar50._0_16_ = auVar44;
                uVar34 = vmovmskps_avx(auVar50);
                auVar77 = _local_5d20;
                if (uVar34 != 0) {
                  _local_5cc0 = _local_5d20;
                  uVar36 = (ulong)(uVar34 & 0xff);
                  local_5ca0 = (undefined1  [8])
                               &pRVar33[(ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 2 + 1].
                                context;
                  do {
                    local_5ce0._0_8_ = uVar36;
                    lVar38 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    local_5c80._0_8_ = lVar38;
                    auVar78 = ZEXT1664(auVar78._0_16_);
                    auVar96 = ZEXT1664(auVar96._0_16_);
                    auVar141 = ZEXT1664(auVar141._0_16_);
                    in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                    pRVar33 = (RTCIntersectArguments *)context;
                    cVar28 = (**(code **)local_5ca0)
                                       (&local_59c0,ray,lVar38,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    auVar73 = auVar78._0_16_;
                    if (cVar28 != '\0') {
                      *(undefined4 *)(local_5a80[0] + local_5c80._0_8_ * 4) = 0xffffffff;
                    }
                    uVar36 = local_5ce0._0_8_ & local_5ce0._0_8_ - 1;
                    auVar77 = _local_5cc0;
                  } while (uVar36 != 0);
                }
                _local_5d20 = vorps_avx(local_5a80[0],auVar77);
                auVar44 = vpcmpeqd_avx(auVar73,auVar73);
                auVar72 = vpcmpgtd_avx(local_5d20._16_16_,auVar44);
                auVar44 = vpcmpgtd_avx(local_5d20._0_16_,auVar44);
                auVar44 = vpor_avx(auVar44,auVar72);
                if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar44[0xf]) goto LAB_0043f82e;
                auVar76._8_4_ = 0xff800000;
                auVar76._0_8_ = 0xff800000ff800000;
                auVar76._12_4_ = 0xff800000;
                auVar76._16_4_ = 0xff800000;
                auVar76._20_4_ = 0xff800000;
                auVar76._24_4_ = 0xff800000;
                auVar76._28_4_ = 0xff800000;
                auVar78 = ZEXT3264(auVar76);
                local_5ac0 = vblendvps_avx(local_5ac0,auVar76,_local_5d20);
              }
              goto LAB_0043ee53;
            }
            uVar31 = root.ptr & 0xfffffffffffffff0;
            uVar34 = (uint)root.ptr & 7;
            pRVar33 = (RTCIntersectArguments *)0x0;
            local_5c80 = vcmpps_avx(local_5ac0,auVar63._0_32_,6);
            auVar45._8_4_ = 0x7f800000;
            auVar45._0_8_ = 0x7f8000007f800000;
            auVar45._12_4_ = 0x7f800000;
            auVar45._16_4_ = 0x7f800000;
            auVar45._20_4_ = 0x7f800000;
            auVar45._24_4_ = 0x7f800000;
            auVar45._28_4_ = 0x7f800000;
            do {
              auVar77 = auVar45;
              uVar2 = *(ulong *)(uVar31 + 0x40 + lVar38 * 2);
              if (uVar2 == 8) {
                auVar63 = ZEXT3264(auVar77);
                break;
              }
              if ((uVar34 == 6) || (uVar34 == 1)) {
                fVar106 = *(float *)(uVar31 + 0x120 + lVar38);
                fVar112 = *(float *)(uVar31 + 0x60 + lVar38);
                auVar94 = *(undefined1 (*) [32])(ray + 0xe0);
                fVar70 = auVar94._0_4_;
                fVar79 = auVar94._4_4_;
                fVar80 = auVar94._8_4_;
                fVar81 = auVar94._12_4_;
                fVar82 = auVar94._16_4_;
                fVar83 = auVar94._20_4_;
                fVar84 = auVar94._24_4_;
                fVar114 = *(float *)(uVar31 + 0x160 + lVar38);
                auVar46._0_4_ = fVar70 * fVar106 + fVar112;
                auVar46._4_4_ = fVar79 * fVar106 + fVar112;
                auVar46._8_4_ = fVar80 * fVar106 + fVar112;
                auVar46._12_4_ = fVar81 * fVar106 + fVar112;
                auVar46._16_4_ = fVar82 * fVar106 + fVar112;
                auVar46._20_4_ = fVar83 * fVar106 + fVar112;
                auVar46._24_4_ = fVar84 * fVar106 + fVar112;
                auVar46._28_4_ = fVar106 + fVar112;
                fVar106 = *(float *)(uVar31 + 0xa0 + lVar38);
                fVar112 = *(float *)(uVar31 + 0x1a0 + lVar38);
                fVar116 = *(float *)(uVar31 + 0xe0 + lVar38);
                auVar56._0_4_ = fVar70 * fVar114 + fVar106;
                auVar56._4_4_ = fVar79 * fVar114 + fVar106;
                auVar56._8_4_ = fVar80 * fVar114 + fVar106;
                auVar56._12_4_ = fVar81 * fVar114 + fVar106;
                auVar56._16_4_ = fVar82 * fVar114 + fVar106;
                auVar56._20_4_ = fVar83 * fVar114 + fVar106;
                auVar56._24_4_ = fVar84 * fVar114 + fVar106;
                auVar56._28_4_ = fVar114 + fVar106;
                fVar106 = *(float *)(uVar31 + 0x140 + lVar38);
                auVar95._0_4_ = fVar70 * fVar112 + fVar116;
                auVar95._4_4_ = fVar79 * fVar112 + fVar116;
                auVar95._8_4_ = fVar80 * fVar112 + fVar116;
                auVar95._12_4_ = fVar81 * fVar112 + fVar116;
                auVar95._16_4_ = fVar82 * fVar112 + fVar116;
                auVar95._20_4_ = fVar83 * fVar112 + fVar116;
                auVar95._24_4_ = fVar84 * fVar112 + fVar116;
                auVar95._28_4_ = fVar114 + fVar116;
                fVar112 = *(float *)(uVar31 + 0x80 + lVar38);
                fVar114 = *(float *)(uVar31 + 0x180 + lVar38);
                fVar116 = *(float *)(uVar31 + 0xc0 + lVar38);
                auVar103._0_4_ = fVar70 * fVar106 + fVar112;
                auVar103._4_4_ = fVar79 * fVar106 + fVar112;
                auVar103._8_4_ = fVar80 * fVar106 + fVar112;
                auVar103._12_4_ = fVar81 * fVar106 + fVar112;
                auVar103._16_4_ = fVar82 * fVar106 + fVar112;
                auVar103._20_4_ = fVar83 * fVar106 + fVar112;
                auVar103._24_4_ = fVar84 * fVar106 + fVar112;
                auVar103._28_4_ = fVar106 + fVar112;
                fVar106 = *(float *)(uVar31 + 0x1c0 + lVar38);
                auVar111._0_4_ = fVar116 + fVar70 * fVar114;
                auVar111._4_4_ = fVar116 + fVar79 * fVar114;
                auVar111._8_4_ = fVar116 + fVar80 * fVar114;
                auVar111._12_4_ = fVar116 + fVar81 * fVar114;
                auVar111._16_4_ = fVar116 + fVar82 * fVar114;
                auVar111._20_4_ = fVar116 + fVar83 * fVar114;
                auVar111._24_4_ = fVar116 + fVar84 * fVar114;
                auVar111._28_4_ = fVar116 + fVar112;
                fVar112 = *(float *)(uVar31 + 0x100 + lVar38);
                auVar119._0_4_ = fVar112 + fVar70 * fVar106;
                auVar119._4_4_ = fVar112 + fVar79 * fVar106;
                auVar119._8_4_ = fVar112 + fVar80 * fVar106;
                auVar119._12_4_ = fVar112 + fVar81 * fVar106;
                auVar119._16_4_ = fVar112 + fVar82 * fVar106;
                auVar119._20_4_ = fVar112 + fVar83 * fVar106;
                auVar119._24_4_ = fVar112 + fVar84 * fVar106;
                auVar119._28_4_ = fVar112 + fVar106;
                auVar21._4_4_ = local_5c60._4_4_;
                auVar21._0_4_ = local_5c60._0_4_;
                auVar21._8_4_ = local_5c60._8_4_;
                auVar21._12_4_ = local_5c60._12_4_;
                auVar21._16_4_ = local_5c60._16_4_;
                auVar21._20_4_ = local_5c60._20_4_;
                auVar21._24_4_ = local_5c60._24_4_;
                auVar21._28_4_ = local_5c60._28_4_;
                auVar22._4_4_ = local_5c60._36_4_;
                auVar22._0_4_ = local_5c60._32_4_;
                auVar22._8_4_ = local_5c60._40_4_;
                auVar22._12_4_ = local_5c60._44_4_;
                auVar22._16_4_ = local_5c60._48_4_;
                auVar22._20_4_ = local_5c60._52_4_;
                auVar22._24_4_ = local_5c60._56_4_;
                auVar22._28_4_ = local_5c60._60_4_;
                auVar23._4_4_ = local_5c60._68_4_;
                auVar23._0_4_ = local_5c60._64_4_;
                auVar23._8_4_ = local_5c60._72_4_;
                auVar23._12_4_ = local_5c60._76_4_;
                auVar23._16_4_ = local_5c60._80_4_;
                auVar23._20_4_ = local_5c60._84_4_;
                auVar23._24_4_ = local_5c60._88_4_;
                auVar23._28_4_ = local_5c60._92_4_;
                auVar55 = vsubps_avx(auVar46,auVar21);
                auVar40._0_4_ = (float)local_5ba0._0_4_ * auVar55._0_4_;
                auVar40._4_4_ = (float)local_5ba0._4_4_ * auVar55._4_4_;
                auVar40._8_4_ = fStack_5b98 * auVar55._8_4_;
                auVar40._12_4_ = fStack_5b94 * auVar55._12_4_;
                auVar3._16_4_ = fStack_5b90 * auVar55._16_4_;
                auVar3._0_16_ = auVar40;
                auVar3._20_4_ = fStack_5b8c * auVar55._20_4_;
                auVar3._24_4_ = fStack_5b88 * auVar55._24_4_;
                auVar3._28_4_ = auVar55._28_4_;
                auVar55 = vsubps_avx(auVar56,auVar22);
                auVar52._0_4_ = (float)local_5b80._0_4_ * auVar55._0_4_;
                auVar52._4_4_ = (float)local_5b80._4_4_ * auVar55._4_4_;
                auVar52._8_4_ = fStack_5b78 * auVar55._8_4_;
                auVar52._12_4_ = fStack_5b74 * auVar55._12_4_;
                auVar4._16_4_ = fStack_5b70 * auVar55._16_4_;
                auVar4._0_16_ = auVar52;
                auVar4._20_4_ = fStack_5b6c * auVar55._20_4_;
                auVar4._24_4_ = fStack_5b68 * auVar55._24_4_;
                auVar4._28_4_ = auVar55._28_4_;
                auVar55 = vsubps_avx(auVar95,auVar23);
                auVar85._0_4_ = (float)local_5b60._0_4_ * auVar55._0_4_;
                auVar85._4_4_ = (float)local_5b60._4_4_ * auVar55._4_4_;
                auVar85._8_4_ = fStack_5b58 * auVar55._8_4_;
                auVar85._12_4_ = fStack_5b54 * auVar55._12_4_;
                auVar5._16_4_ = fStack_5b50 * auVar55._16_4_;
                auVar5._0_16_ = auVar85;
                auVar5._20_4_ = fStack_5b4c * auVar55._20_4_;
                auVar5._24_4_ = fStack_5b48 * auVar55._24_4_;
                auVar5._28_4_ = auVar55._28_4_;
                auVar101 = vsubps_avx(auVar103,auVar21);
                auVar99._0_4_ = (float)local_5ba0._0_4_ * auVar101._0_4_;
                auVar99._4_4_ = (float)local_5ba0._4_4_ * auVar101._4_4_;
                auVar99._8_4_ = fStack_5b98 * auVar101._8_4_;
                auVar99._12_4_ = fStack_5b94 * auVar101._12_4_;
                auVar6._16_4_ = fStack_5b90 * auVar101._16_4_;
                auVar6._0_16_ = auVar99;
                auVar6._20_4_ = fStack_5b8c * auVar101._20_4_;
                auVar6._24_4_ = fStack_5b88 * auVar101._24_4_;
                auVar6._28_4_ = auVar101._28_4_;
                auVar101 = vsubps_avx(auVar111,auVar22);
                auVar108._0_4_ = (float)local_5b80._0_4_ * auVar101._0_4_;
                auVar108._4_4_ = (float)local_5b80._4_4_ * auVar101._4_4_;
                auVar108._8_4_ = fStack_5b78 * auVar101._8_4_;
                auVar108._12_4_ = fStack_5b74 * auVar101._12_4_;
                auVar7._16_4_ = fStack_5b70 * auVar101._16_4_;
                auVar7._0_16_ = auVar108;
                auVar7._20_4_ = fStack_5b6c * auVar101._20_4_;
                auVar7._24_4_ = fStack_5b68 * auVar101._24_4_;
                auVar7._28_4_ = auVar101._28_4_;
                auVar101 = vsubps_avx(auVar119,auVar23);
                auVar117._0_4_ = (float)local_5b60._0_4_ * auVar101._0_4_;
                auVar117._4_4_ = (float)local_5b60._4_4_ * auVar101._4_4_;
                auVar117._8_4_ = fStack_5b58 * auVar101._8_4_;
                auVar117._12_4_ = fStack_5b54 * auVar101._12_4_;
                auVar8._16_4_ = fStack_5b50 * auVar101._16_4_;
                auVar8._0_16_ = auVar117;
                auVar8._20_4_ = fStack_5b4c * auVar101._20_4_;
                auVar8._24_4_ = fStack_5b48 * auVar101._24_4_;
                auVar8._28_4_ = auVar101._28_4_;
                auVar44 = vpminsd_avx(auVar3._16_16_,auVar6._16_16_);
                auVar72 = vpminsd_avx(auVar40,auVar99);
                auVar54 = vpminsd_avx(auVar4._16_16_,auVar7._16_16_);
                auVar44 = vpmaxsd_avx(auVar44,auVar54);
                auVar54 = vpminsd_avx(auVar52,auVar108);
                auVar72 = vpmaxsd_avx(auVar72,auVar54);
                auVar54 = vpminsd_avx(auVar85,auVar117);
                auVar72 = vpmaxsd_avx(auVar72,auVar54);
                auVar123 = auVar8._16_16_;
                auVar141 = ZEXT1664(auVar123);
                auVar97 = auVar5._16_16_;
                in_ZMM15 = ZEXT1664(auVar97);
                auVar54 = vpminsd_avx(auVar97,auVar123);
                auVar44 = vpmaxsd_avx(auVar44,auVar54);
                auVar54 = vpmaxsd_avx(auVar3._16_16_,auVar6._16_16_);
                auVar137 = vpmaxsd_avx(auVar40,auVar99);
                auVar134 = vpmaxsd_avx(auVar4._16_16_,auVar7._16_16_);
                auVar134 = vpminsd_avx(auVar54,auVar134);
                auVar54 = vpmaxsd_avx(auVar52,auVar108);
                auVar137 = vpminsd_avx(auVar137,auVar54);
                auVar54 = vpmaxsd_avx(auVar85,auVar117);
                auVar54 = vpminsd_avx(auVar137,auVar54);
                auVar86._0_4_ = auVar72._0_4_ * 0.99999964;
                auVar86._4_4_ = auVar72._4_4_ * 0.99999964;
                auVar86._8_4_ = auVar72._8_4_ * 0.99999964;
                auVar86._12_4_ = auVar72._12_4_ * 0.99999964;
                auVar9._16_4_ = auVar44._0_4_ * 0.99999964;
                auVar9._0_16_ = auVar86;
                auVar9._20_4_ = auVar44._4_4_ * 0.99999964;
                auVar9._24_4_ = auVar44._8_4_ * 0.99999964;
                auVar9._28_4_ = auVar55._28_4_;
                auVar96 = ZEXT3264(auVar9);
                auVar44 = vpmaxsd_avx(auVar97,auVar123);
                auVar44 = vpminsd_avx(auVar134,auVar44);
                auVar41._0_4_ = auVar54._0_4_ * 1.0000004;
                auVar41._4_4_ = auVar54._4_4_ * 1.0000004;
                auVar41._8_4_ = auVar54._8_4_ * 1.0000004;
                auVar41._12_4_ = auVar54._12_4_ * 1.0000004;
                auVar10._16_4_ = auVar44._0_4_ * 1.0000004;
                auVar10._0_16_ = auVar41;
                auVar10._20_4_ = auVar44._4_4_ * 1.0000004;
                auVar10._24_4_ = auVar44._8_4_ * 1.0000004;
                auVar10._28_4_ = auVar44._12_4_;
                auVar44 = vpmaxsd_avx(auVar86,local_5ae0._0_16_);
                auVar72 = vpmaxsd_avx(auVar9._16_16_,local_5ae0._16_16_);
                auVar54 = vpminsd_avx(auVar41,local_5ac0._0_16_);
                auVar137 = vpminsd_avx(auVar10._16_16_,local_5ac0._16_16_);
                auVar57._16_16_ = auVar72;
                auVar57._0_16_ = auVar44;
                auVar47._16_16_ = auVar137;
                auVar47._0_16_ = auVar54;
                auVar55 = vcmpps_avx(auVar57,auVar47,2);
                if (uVar34 == 6) {
                  uVar32 = *(undefined4 *)(uVar31 + 0x1e0 + lVar38);
                  auVar58._4_4_ = uVar32;
                  auVar58._0_4_ = uVar32;
                  auVar58._8_4_ = uVar32;
                  auVar58._12_4_ = uVar32;
                  auVar58._16_4_ = uVar32;
                  auVar58._20_4_ = uVar32;
                  auVar58._24_4_ = uVar32;
                  auVar58._28_4_ = uVar32;
                  auVar101 = vcmpps_avx(auVar58,auVar94,2);
                  uVar32 = *(undefined4 *)(uVar31 + 0x200 + lVar38);
                  auVar104._4_4_ = uVar32;
                  auVar104._0_4_ = uVar32;
                  auVar104._8_4_ = uVar32;
                  auVar104._12_4_ = uVar32;
                  auVar104._16_4_ = uVar32;
                  auVar104._20_4_ = uVar32;
                  auVar104._24_4_ = uVar32;
                  auVar104._28_4_ = uVar32;
                  auVar94 = vcmpps_avx(auVar94,auVar104,1);
                  auVar94 = vandps_avx(auVar101,auVar94);
                  auVar55 = vandps_avx(auVar94,auVar55);
                }
              }
              else {
                fVar106 = *(float *)(uVar31 + 0xc0 + lVar38);
                fVar112 = *(float *)(uVar31 + 0xe0 + lVar38);
                fVar114 = *(float *)(uVar31 + 0x100 + lVar38);
                fVar116 = *(float *)(uVar31 + 0x120 + lVar38);
                fVar70 = *(float *)(uVar31 + 0x140 + lVar38);
                fStack_5a04 = *(float *)(uVar31 + 0x1e0 + lVar38);
                fStack_59e4 = *(float *)(uVar31 + 0x200 + lVar38);
                fVar79 = *(float *)(uVar31 + 0x220 + lVar38);
                fVar80 = *(float *)(uVar31 + 0x240 + lVar38);
                fVar81 = *(float *)(uVar31 + 0x260 + lVar38);
                fVar82 = *(float *)(uVar31 + 0x280 + lVar38);
                auVar94 = *(undefined1 (*) [32])(ray + 0xe0);
                auVar74._8_4_ = 0x3f800000;
                auVar74._0_8_ = 0x3f8000003f800000;
                auVar74._12_4_ = 0x3f800000;
                auVar74._16_4_ = 0x3f800000;
                auVar74._20_4_ = 0x3f800000;
                auVar74._24_4_ = 0x3f800000;
                auVar74._28_4_ = 0x3f800000;
                auVar55 = vsubps_avx(auVar74,auVar94);
                fVar83 = auVar94._0_4_;
                fVar84 = auVar94._4_4_;
                fVar135 = auVar94._8_4_;
                fVar51 = auVar94._12_4_;
                fVar64 = auVar94._16_4_;
                fVar65 = auVar94._20_4_;
                fVar66 = auVar94._24_4_;
                fVar67 = auVar55._0_4_;
                fVar140 = fVar67 * 0.0;
                fVar68 = auVar55._4_4_;
                fVar142 = fVar68 * 0.0;
                fVar69 = auVar55._8_4_;
                fVar143 = fVar69 * 0.0;
                fVar98 = auVar55._12_4_;
                fVar144 = fVar98 * 0.0;
                fVar107 = auVar55._16_4_;
                fVar145 = fVar107 * 0.0;
                fVar113 = auVar55._20_4_;
                fVar146 = fVar113 * 0.0;
                fVar115 = auVar55._24_4_;
                fVar147 = fVar115 * 0.0;
                local_5a20 = fVar140 + fVar83 * fStack_5a04;
                fStack_5a1c = fVar142 + fVar84 * fStack_5a04;
                fStack_5a18 = fVar143 + fVar135 * fStack_5a04;
                fStack_5a14 = fVar144 + fVar51 * fStack_5a04;
                fStack_5a10 = fVar145 + fVar64 * fStack_5a04;
                fStack_5a0c = fVar146 + fVar65 * fStack_5a04;
                fStack_5a08 = fVar147 + fVar66 * fStack_5a04;
                fVar121 = auVar141._28_4_;
                fStack_5a04 = fVar121 + fStack_5a04;
                local_59e0 = fVar140 + fVar83 * fStack_59e4;
                fStack_59dc = fVar142 + fVar84 * fStack_59e4;
                fStack_59d8 = fVar143 + fVar135 * fStack_59e4;
                fStack_59d4 = fVar144 + fVar51 * fStack_59e4;
                fStack_59d0 = fVar145 + fVar64 * fStack_59e4;
                fStack_59cc = fVar146 + fVar65 * fStack_59e4;
                fStack_59c8 = fVar147 + fVar66 * fStack_59e4;
                fStack_59c4 = fVar121 + fStack_59e4;
                local_5ca0._4_4_ = fVar142 + fVar84 * fVar79;
                local_5ca0._0_4_ = fVar140 + fVar83 * fVar79;
                fStack_5c98 = fVar143 + fVar135 * fVar79;
                fStack_5c94 = fVar144 + fVar51 * fVar79;
                fStack_5c90 = fVar145 + fVar64 * fVar79;
                fStack_5c8c = fVar146 + fVar65 * fVar79;
                fStack_5c88 = fVar147 + fVar66 * fVar79;
                fStack_5c84 = fVar121 + fVar79;
                local_5a40 = fVar67 + fVar83 * fVar80;
                fStack_5a3c = fVar68 + fVar84 * fVar80;
                fStack_5a38 = fVar69 + fVar135 * fVar80;
                fStack_5a34 = fVar98 + fVar51 * fVar80;
                fStack_5a30 = fVar107 + fVar64 * fVar80;
                fStack_5a2c = fVar113 + fVar65 * fVar80;
                fStack_5a28 = fVar115 + fVar66 * fVar80;
                fStack_5ca4 = auVar55._28_4_;
                fStack_5a24 = fStack_5ca4 + fVar121 + fVar79;
                local_5a00 = fVar67 + fVar83 * fVar81;
                fStack_59fc = fVar68 + fVar84 * fVar81;
                fStack_59f8 = fVar69 + fVar135 * fVar81;
                fStack_59f4 = fVar98 + fVar51 * fVar81;
                fStack_59f0 = fVar107 + fVar64 * fVar81;
                fStack_59ec = fVar113 + fVar65 * fVar81;
                fStack_59e8 = fVar115 + fVar66 * fVar81;
                fStack_59e4 = fStack_5ca4 + fStack_59e4;
                fStack_5ca4 = fStack_5ca4 + fVar79;
                local_5cc0._4_4_ = fVar68 + fVar84 * fVar82;
                local_5cc0._0_4_ = fVar67 + fVar83 * fVar82;
                fStack_5cb8 = fVar69 + fVar135 * fVar82;
                fStack_5cb4 = fVar98 + fVar51 * fVar82;
                fStack_5cb0 = fVar107 + fVar64 * fVar82;
                fStack_5cac = fVar113 + fVar65 * fVar82;
                fStack_5ca8 = fVar115 + fVar66 * fVar82;
                fVar79 = *(float *)(uVar31 + 0x160 + lVar38);
                fVar83 = *(float *)(uVar31 + 0x60 + lVar38);
                fVar84 = *(float *)(uVar31 + 0x80 + lVar38);
                auVar127._0_4_ =
                     fVar83 * (float)local_5c00._0_4_ +
                     fVar106 * (float)local_5be0._0_4_ + fVar116 * (float)local_5bc0._0_4_;
                auVar127._4_4_ =
                     fVar83 * (float)local_5c00._4_4_ +
                     fVar106 * (float)local_5be0._4_4_ + fVar116 * (float)local_5bc0._4_4_;
                auVar127._8_4_ =
                     fVar83 * fStack_5bf8 + fVar106 * fStack_5bd8 + fVar116 * fStack_5bb8;
                auVar127._12_4_ =
                     fVar83 * fStack_5bf4 + fVar106 * fStack_5bd4 + fVar116 * fStack_5bb4;
                auVar127._16_4_ =
                     fVar83 * fStack_5bf0 + fVar106 * fStack_5bd0 + fVar116 * fStack_5bb0;
                auVar127._20_4_ =
                     fVar83 * fStack_5bec + fVar106 * fStack_5bcc + fVar116 * fStack_5bac;
                auVar127._24_4_ =
                     fVar83 * fStack_5be8 + fVar106 * fStack_5bc8 + fVar116 * fStack_5ba8;
                auVar127._28_4_ = in_ZMM15._28_4_ + fVar81 + fStack_5ca4;
                fVar81 = *(float *)(uVar31 + 0xa0 + lVar38);
                in_ZMM15 = ZEXT3264(CONCAT428(fVar81,CONCAT424(fVar81,CONCAT420(fVar81,CONCAT416(
                                                  fVar81,CONCAT412(fVar81,CONCAT48(fVar81,CONCAT44(
                                                  fVar81,fVar81))))))));
                auVar120._0_4_ =
                     fVar84 * (float)local_5c00._0_4_ +
                     fVar112 * (float)local_5be0._0_4_ + fVar70 * (float)local_5bc0._0_4_;
                auVar120._4_4_ =
                     fVar84 * (float)local_5c00._4_4_ +
                     fVar112 * (float)local_5be0._4_4_ + fVar70 * (float)local_5bc0._4_4_;
                auVar120._8_4_ = fVar84 * fStack_5bf8 + fVar112 * fStack_5bd8 + fVar70 * fStack_5bb8
                ;
                auVar120._12_4_ =
                     fVar84 * fStack_5bf4 + fVar112 * fStack_5bd4 + fVar70 * fStack_5bb4;
                auVar120._16_4_ =
                     fVar84 * fStack_5bf0 + fVar112 * fStack_5bd0 + fVar70 * fStack_5bb0;
                auVar120._20_4_ =
                     fVar84 * fStack_5bec + fVar112 * fStack_5bcc + fVar70 * fStack_5bac;
                auVar120._24_4_ =
                     fVar84 * fStack_5be8 + fVar112 * fStack_5bc8 + fVar70 * fStack_5ba8;
                auVar120._28_4_ = fVar82 + fStack_5ca4 + fVar80;
                auVar59._0_4_ =
                     fVar81 * (float)local_5c00._0_4_ +
                     fVar114 * (float)local_5be0._0_4_ + fVar79 * (float)local_5bc0._0_4_;
                auVar59._4_4_ =
                     fVar81 * (float)local_5c00._4_4_ +
                     fVar114 * (float)local_5be0._4_4_ + fVar79 * (float)local_5bc0._4_4_;
                auVar59._8_4_ = fVar81 * fStack_5bf8 + fVar114 * fStack_5bd8 + fVar79 * fStack_5bb8;
                auVar59._12_4_ = fVar81 * fStack_5bf4 + fVar114 * fStack_5bd4 + fVar79 * fStack_5bb4
                ;
                auVar59._16_4_ = fVar81 * fStack_5bf0 + fVar114 * fStack_5bd0 + fVar79 * fStack_5bb0
                ;
                auVar59._20_4_ = fVar81 * fStack_5bec + fVar114 * fStack_5bcc + fVar79 * fStack_5bac
                ;
                auVar59._24_4_ = fVar81 * fStack_5be8 + fVar114 * fStack_5bc8 + fVar79 * fStack_5ba8
                ;
                auVar59._28_4_ = fStack_5be4 + fStack_5bc4 + fStack_5ba4;
                auVar130._8_4_ = 0x7fffffff;
                auVar130._0_8_ = 0x7fffffff7fffffff;
                auVar130._12_4_ = 0x7fffffff;
                auVar130._16_4_ = 0x7fffffff;
                auVar130._20_4_ = 0x7fffffff;
                auVar130._24_4_ = 0x7fffffff;
                auVar130._28_4_ = 0x7fffffff;
                auVar94 = vandps_avx(auVar130,auVar127);
                auVar133._8_4_ = 0x219392ef;
                auVar133._0_8_ = 0x219392ef219392ef;
                auVar133._12_4_ = 0x219392ef;
                auVar133._16_4_ = 0x219392ef;
                auVar133._20_4_ = 0x219392ef;
                auVar133._24_4_ = 0x219392ef;
                auVar133._28_4_ = 0x219392ef;
                auVar94 = vcmpps_avx(auVar94,auVar133,1);
                auVar55 = vblendvps_avx(auVar127,auVar133,auVar94);
                auVar94 = vandps_avx(auVar130,auVar120);
                auVar94 = vcmpps_avx(auVar94,auVar133,1);
                auVar101 = vblendvps_avx(auVar120,auVar133,auVar94);
                auVar94 = vandps_avx(auVar130,auVar59);
                auVar94 = vcmpps_avx(auVar94,auVar133,1);
                auVar90 = vrcpps_avx(auVar55);
                auVar94 = vblendvps_avx(auVar59,auVar133,auVar94);
                fVar51 = auVar90._0_4_;
                fVar64 = auVar90._4_4_;
                auVar11._4_4_ = fVar64 * auVar55._4_4_;
                auVar11._0_4_ = fVar51 * auVar55._0_4_;
                fVar65 = auVar90._8_4_;
                auVar11._8_4_ = fVar65 * auVar55._8_4_;
                fVar66 = auVar90._12_4_;
                auVar11._12_4_ = fVar66 * auVar55._12_4_;
                fVar67 = auVar90._16_4_;
                auVar11._16_4_ = fVar67 * auVar55._16_4_;
                fVar68 = auVar90._20_4_;
                auVar11._20_4_ = fVar68 * auVar55._20_4_;
                fVar69 = auVar90._24_4_;
                auVar11._24_4_ = fVar69 * auVar55._24_4_;
                auVar11._28_4_ = auVar59._28_4_;
                auVar91 = vsubps_avx(auVar74,auVar11);
                auVar55 = vrcpps_avx(auVar101);
                fVar51 = fVar51 + fVar51 * auVar91._0_4_;
                fVar64 = fVar64 + fVar64 * auVar91._4_4_;
                fVar65 = fVar65 + fVar65 * auVar91._8_4_;
                fVar66 = fVar66 + fVar66 * auVar91._12_4_;
                fVar67 = fVar67 + fVar67 * auVar91._16_4_;
                fVar68 = fVar68 + fVar68 * auVar91._20_4_;
                fVar69 = fVar69 + fVar69 * auVar91._24_4_;
                fVar107 = auVar55._0_4_;
                fVar113 = auVar55._4_4_;
                auVar12._4_4_ = fVar113 * auVar101._4_4_;
                auVar12._0_4_ = fVar107 * auVar101._0_4_;
                fVar115 = auVar55._8_4_;
                auVar12._8_4_ = fVar115 * auVar101._8_4_;
                fVar140 = auVar55._12_4_;
                auVar12._12_4_ = fVar140 * auVar101._12_4_;
                fVar142 = auVar55._16_4_;
                auVar12._16_4_ = fVar142 * auVar101._16_4_;
                fVar143 = auVar55._20_4_;
                auVar12._20_4_ = fVar143 * auVar101._20_4_;
                fVar144 = auVar55._24_4_;
                auVar12._24_4_ = fVar144 * auVar101._24_4_;
                auVar12._28_4_ = auVar101._28_4_;
                auVar55 = vsubps_avx(auVar74,auVar12);
                fVar107 = fVar107 + fVar107 * auVar55._0_4_;
                fVar113 = fVar113 + fVar113 * auVar55._4_4_;
                fVar115 = fVar115 + fVar115 * auVar55._8_4_;
                fVar140 = fVar140 + fVar140 * auVar55._12_4_;
                fVar142 = fVar142 + fVar142 * auVar55._16_4_;
                fVar143 = fVar143 + fVar143 * auVar55._20_4_;
                fVar144 = fVar144 + fVar144 * auVar55._24_4_;
                auVar55 = vrcpps_avx(auVar94);
                fVar145 = auVar55._0_4_;
                fVar146 = auVar55._4_4_;
                auVar13._4_4_ = fVar146 * auVar94._4_4_;
                auVar13._0_4_ = fVar145 * auVar94._0_4_;
                fVar147 = auVar55._8_4_;
                auVar13._8_4_ = fVar147 * auVar94._8_4_;
                fVar121 = auVar55._12_4_;
                auVar13._12_4_ = fVar121 * auVar94._12_4_;
                fVar122 = auVar55._16_4_;
                auVar13._16_4_ = fVar122 * auVar94._16_4_;
                fVar124 = auVar55._20_4_;
                auVar13._20_4_ = fVar124 * auVar94._20_4_;
                fVar125 = auVar55._24_4_;
                auVar13._24_4_ = fVar125 * auVar94._24_4_;
                auVar13._28_4_ = auVar94._28_4_;
                auVar94 = vsubps_avx(auVar74,auVar13);
                fVar145 = fVar145 + fVar145 * auVar94._0_4_;
                fVar146 = fVar146 + fVar146 * auVar94._4_4_;
                fVar147 = fVar147 + fVar147 * auVar94._8_4_;
                fVar121 = fVar121 + fVar121 * auVar94._12_4_;
                fVar122 = fVar122 + fVar122 * auVar94._16_4_;
                fVar124 = fVar124 + fVar124 * auVar94._20_4_;
                fVar125 = fVar125 + fVar125 * auVar94._24_4_;
                fVar80 = *(float *)(uVar31 + 0x180 + lVar38);
                fVar82 = *(float *)(uVar31 + 0x1a0 + lVar38);
                fVar135 = *(float *)(uVar31 + 0x1c0 + lVar38);
                fVar98 = fVar82 + fVar70 + fVar112;
                auVar105._0_4_ =
                     fVar83 * (float)local_5c60._0_4_ +
                     fVar80 + fVar116 * (float)local_5c60._64_4_ +
                     fVar106 * (float)local_5c60._32_4_;
                auVar105._4_4_ =
                     fVar83 * (float)local_5c60._4_4_ +
                     fVar80 + fVar116 * (float)local_5c60._68_4_ +
                     fVar106 * (float)local_5c60._36_4_;
                auVar105._8_4_ =
                     fVar83 * (float)local_5c60._8_4_ +
                     fVar80 + fVar116 * (float)local_5c60._72_4_ +
                     fVar106 * (float)local_5c60._40_4_;
                auVar105._12_4_ =
                     fVar83 * (float)local_5c60._12_4_ +
                     fVar80 + fVar116 * (float)local_5c60._76_4_ +
                     fVar106 * (float)local_5c60._44_4_;
                auVar105._16_4_ =
                     fVar83 * (float)local_5c60._16_4_ +
                     fVar80 + fVar116 * (float)local_5c60._80_4_ +
                     fVar106 * (float)local_5c60._48_4_;
                auVar105._20_4_ =
                     fVar83 * (float)local_5c60._20_4_ +
                     fVar80 + fVar116 * (float)local_5c60._84_4_ +
                     fVar106 * (float)local_5c60._52_4_;
                auVar105._24_4_ =
                     fVar83 * (float)local_5c60._24_4_ +
                     fVar80 + fVar116 * (float)local_5c60._88_4_ +
                     fVar106 * (float)local_5c60._56_4_;
                auVar105._28_4_ = (float)local_5c60._60_4_ + fVar80 + auVar90._28_4_ + fVar106;
                auVar128._0_4_ =
                     fVar84 * (float)local_5c60._0_4_ +
                     fVar82 + fVar70 * (float)local_5c60._64_4_ + fVar112 * (float)local_5c60._32_4_
                ;
                auVar128._4_4_ =
                     fVar84 * (float)local_5c60._4_4_ +
                     fVar82 + fVar70 * (float)local_5c60._68_4_ + fVar112 * (float)local_5c60._36_4_
                ;
                auVar128._8_4_ =
                     fVar84 * (float)local_5c60._8_4_ +
                     fVar82 + fVar70 * (float)local_5c60._72_4_ + fVar112 * (float)local_5c60._40_4_
                ;
                auVar128._12_4_ =
                     fVar84 * (float)local_5c60._12_4_ +
                     fVar82 + fVar70 * (float)local_5c60._76_4_ + fVar112 * (float)local_5c60._44_4_
                ;
                auVar128._16_4_ =
                     fVar84 * (float)local_5c60._16_4_ +
                     fVar82 + fVar70 * (float)local_5c60._80_4_ + fVar112 * (float)local_5c60._48_4_
                ;
                auVar128._20_4_ =
                     fVar84 * (float)local_5c60._20_4_ +
                     fVar82 + fVar70 * (float)local_5c60._84_4_ + fVar112 * (float)local_5c60._52_4_
                ;
                auVar128._24_4_ =
                     fVar84 * (float)local_5c60._24_4_ +
                     fVar82 + fVar70 * (float)local_5c60._88_4_ + fVar112 * (float)local_5c60._56_4_
                ;
                auVar128._28_4_ = (float)local_5c60._60_4_ + fVar98;
                auVar131._0_4_ =
                     fVar81 * (float)local_5c60._0_4_ +
                     fVar114 * (float)local_5c60._32_4_ +
                     fVar135 + fVar79 * (float)local_5c60._64_4_;
                auVar131._4_4_ =
                     fVar81 * (float)local_5c60._4_4_ +
                     fVar114 * (float)local_5c60._36_4_ +
                     fVar135 + fVar79 * (float)local_5c60._68_4_;
                auVar131._8_4_ =
                     fVar81 * (float)local_5c60._8_4_ +
                     fVar114 * (float)local_5c60._40_4_ +
                     fVar135 + fVar79 * (float)local_5c60._72_4_;
                auVar131._12_4_ =
                     fVar81 * (float)local_5c60._12_4_ +
                     fVar114 * (float)local_5c60._44_4_ +
                     fVar135 + fVar79 * (float)local_5c60._76_4_;
                auVar131._16_4_ =
                     fVar81 * (float)local_5c60._16_4_ +
                     fVar114 * (float)local_5c60._48_4_ +
                     fVar135 + fVar79 * (float)local_5c60._80_4_;
                auVar131._20_4_ =
                     fVar81 * (float)local_5c60._20_4_ +
                     fVar114 * (float)local_5c60._52_4_ +
                     fVar135 + fVar79 * (float)local_5c60._84_4_;
                auVar131._24_4_ =
                     fVar81 * (float)local_5c60._24_4_ +
                     fVar114 * (float)local_5c60._56_4_ +
                     fVar135 + fVar79 * (float)local_5c60._88_4_;
                auVar131._28_4_ = (float)local_5c60._28_4_ + fVar135 + fVar79 + 1.0;
                auVar25._4_4_ = fStack_5a1c;
                auVar25._0_4_ = local_5a20;
                auVar25._8_4_ = fStack_5a18;
                auVar25._12_4_ = fStack_5a14;
                auVar25._16_4_ = fStack_5a10;
                auVar25._20_4_ = fStack_5a0c;
                auVar25._24_4_ = fStack_5a08;
                auVar25._28_4_ = fStack_5a04;
                auVar94 = vsubps_avx(auVar25,auVar105);
                auVar87._0_4_ = fVar51 * auVar94._0_4_;
                auVar87._4_4_ = fVar64 * auVar94._4_4_;
                auVar87._8_4_ = fVar65 * auVar94._8_4_;
                auVar87._12_4_ = fVar66 * auVar94._12_4_;
                auVar14._16_4_ = fVar67 * auVar94._16_4_;
                auVar14._0_16_ = auVar87;
                auVar14._20_4_ = fVar68 * auVar94._20_4_;
                auVar14._24_4_ = fVar69 * auVar94._24_4_;
                auVar14._28_4_ = fVar98;
                auVar27._4_4_ = fStack_59dc;
                auVar27._0_4_ = local_59e0;
                auVar27._8_4_ = fStack_59d8;
                auVar27._12_4_ = fStack_59d4;
                auVar27._16_4_ = fStack_59d0;
                auVar27._20_4_ = fStack_59cc;
                auVar27._24_4_ = fStack_59c8;
                auVar27._28_4_ = fStack_59c4;
                auVar94 = vsubps_avx(auVar27,auVar128);
                auVar42._0_4_ = fVar107 * auVar94._0_4_;
                auVar42._4_4_ = fVar113 * auVar94._4_4_;
                auVar42._8_4_ = fVar115 * auVar94._8_4_;
                auVar42._12_4_ = fVar140 * auVar94._12_4_;
                auVar15._16_4_ = fVar142 * auVar94._16_4_;
                auVar15._0_16_ = auVar42;
                auVar15._20_4_ = fVar143 * auVar94._20_4_;
                auVar15._24_4_ = fVar144 * auVar94._24_4_;
                auVar15._28_4_ = auVar94._28_4_;
                auVar94 = vsubps_avx(_local_5ca0,auVar131);
                auVar71._0_4_ = fVar145 * auVar94._0_4_;
                auVar71._4_4_ = fVar146 * auVar94._4_4_;
                auVar71._8_4_ = fVar147 * auVar94._8_4_;
                auVar71._12_4_ = fVar121 * auVar94._12_4_;
                auVar16._16_4_ = fVar122 * auVar94._16_4_;
                auVar16._0_16_ = auVar71;
                auVar16._20_4_ = fVar124 * auVar94._20_4_;
                auVar16._24_4_ = fVar125 * auVar94._24_4_;
                auVar16._28_4_ = auVar94._28_4_;
                auVar24._4_4_ = fStack_5a3c;
                auVar24._0_4_ = local_5a40;
                auVar24._8_4_ = fStack_5a38;
                auVar24._12_4_ = fStack_5a34;
                auVar24._16_4_ = fStack_5a30;
                auVar24._20_4_ = fStack_5a2c;
                auVar24._24_4_ = fStack_5a28;
                auVar24._28_4_ = fStack_5a24;
                auVar94 = vsubps_avx(auVar24,auVar105);
                auVar53._0_4_ = fVar51 * auVar94._0_4_;
                auVar53._4_4_ = fVar64 * auVar94._4_4_;
                auVar53._8_4_ = fVar65 * auVar94._8_4_;
                auVar53._12_4_ = fVar66 * auVar94._12_4_;
                auVar17._16_4_ = fVar67 * auVar94._16_4_;
                auVar17._0_16_ = auVar53;
                auVar17._20_4_ = fVar68 * auVar94._20_4_;
                auVar17._24_4_ = fVar69 * auVar94._24_4_;
                auVar17._28_4_ = auVar90._28_4_ + auVar91._28_4_;
                auVar26._4_4_ = fStack_59fc;
                auVar26._0_4_ = local_5a00;
                auVar26._8_4_ = fStack_59f8;
                auVar26._12_4_ = fStack_59f4;
                auVar26._16_4_ = fStack_59f0;
                auVar26._20_4_ = fStack_59ec;
                auVar26._24_4_ = fStack_59e8;
                auVar26._28_4_ = fStack_59e4;
                auVar94 = vsubps_avx(auVar26,auVar128);
                auVar100._0_4_ = fVar107 * auVar94._0_4_;
                auVar100._4_4_ = fVar113 * auVar94._4_4_;
                auVar100._8_4_ = fVar115 * auVar94._8_4_;
                auVar100._12_4_ = fVar140 * auVar94._12_4_;
                auVar18._16_4_ = fVar142 * auVar94._16_4_;
                auVar18._0_16_ = auVar100;
                auVar18._20_4_ = fVar143 * auVar94._20_4_;
                auVar18._24_4_ = fVar144 * auVar94._24_4_;
                auVar18._28_4_ = auVar94._28_4_;
                auVar94 = vsubps_avx(_local_5cc0,auVar131);
                auVar109._0_4_ = fVar145 * auVar94._0_4_;
                auVar109._4_4_ = fVar146 * auVar94._4_4_;
                auVar109._8_4_ = fVar147 * auVar94._8_4_;
                auVar109._12_4_ = fVar121 * auVar94._12_4_;
                auVar19._16_4_ = fVar122 * auVar94._16_4_;
                auVar19._0_16_ = auVar109;
                auVar19._20_4_ = fVar124 * auVar94._20_4_;
                auVar19._24_4_ = fVar125 * auVar94._24_4_;
                auVar19._28_4_ = auVar94._28_4_;
                auVar44 = vpminsd_avx(auVar14._16_16_,auVar17._16_16_);
                auVar72 = vpminsd_avx(auVar87,auVar53);
                auVar54 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
                auVar44 = vpmaxsd_avx(auVar44,auVar54);
                auVar54 = vpminsd_avx(auVar42,auVar100);
                auVar72 = vpmaxsd_avx(auVar72,auVar54);
                auVar54 = vpminsd_avx(auVar71,auVar109);
                auVar72 = vpmaxsd_avx(auVar72,auVar54);
                auVar54 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
                auVar141 = ZEXT1664(auVar54);
                auVar44 = vpmaxsd_avx(auVar44,auVar54);
                auVar54 = vpmaxsd_avx(auVar14._16_16_,auVar17._16_16_);
                auVar137 = vpmaxsd_avx(auVar87,auVar53);
                auVar134 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
                auVar134 = vpminsd_avx(auVar54,auVar134);
                auVar54 = vpmaxsd_avx(auVar42,auVar100);
                auVar137 = vpminsd_avx(auVar137,auVar54);
                auVar54 = vpmaxsd_avx(auVar71,auVar109);
                auVar137 = vpminsd_avx(auVar137,auVar54);
                auVar54 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
                auVar54 = vpminsd_avx(auVar134,auVar54);
                auVar88._0_4_ = auVar72._0_4_ * 0.99999964;
                auVar88._4_4_ = auVar72._4_4_ * 0.99999964;
                auVar88._8_4_ = auVar72._8_4_ * 0.99999964;
                auVar88._12_4_ = auVar72._12_4_ * 0.99999964;
                auVar89._16_4_ = auVar44._0_4_ * 0.99999964;
                auVar89._0_16_ = auVar88;
                auVar89._20_4_ = auVar44._4_4_ * 0.99999964;
                auVar89._24_4_ = auVar44._8_4_ * 0.99999964;
                auVar96 = ZEXT2864(auVar89);
                auVar43._0_4_ = auVar137._0_4_ * 1.0000004;
                auVar43._4_4_ = auVar137._4_4_ * 1.0000004;
                auVar43._8_4_ = auVar137._8_4_ * 1.0000004;
                auVar43._12_4_ = auVar137._12_4_ * 1.0000004;
                auVar20._16_4_ = auVar54._0_4_ * 1.0000004;
                auVar20._0_16_ = auVar43;
                auVar20._20_4_ = auVar54._4_4_ * 1.0000004;
                auVar20._24_4_ = auVar54._8_4_ * 1.0000004;
                auVar20._28_4_ = auVar54._12_4_;
                auVar44 = vpmaxsd_avx(auVar88,local_5ae0._0_16_);
                auVar72._12_4_ = 0;
                auVar72._0_12_ = auVar89._16_12_;
                auVar72 = vpmaxsd_avx(auVar72,local_5ae0._16_16_);
                auVar54 = vpminsd_avx(auVar43,local_5ac0._0_16_);
                auVar60._16_16_ = auVar72;
                auVar60._0_16_ = auVar44;
                auVar44 = vpminsd_avx(auVar20._16_16_,local_5ac0._16_16_);
                auVar48._16_16_ = auVar44;
                auVar48._0_16_ = auVar54;
                auVar55 = vcmpps_avx(auVar60,auVar48,2);
              }
              auVar44 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
              auVar72 = vpackssdw_avx(local_5c80._0_16_,local_5c80._16_16_);
              auVar44 = vpand_avx(auVar44,auVar72);
              auVar72 = vpmovzxwd_avx(auVar44);
              auVar54 = vpslld_avx(auVar72,0x1f);
              auVar72 = vpunpckhwd_avx(auVar44,auVar44);
              auVar72 = vpslld_avx(auVar72,0x1f);
              auVar75._16_16_ = auVar72;
              auVar75._0_16_ = auVar54;
              auVar78 = ZEXT3264(auVar75);
              if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar75 >> 0x7f,0) == '\0') &&
                    (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar72 >> 0x3f,0) == '\0') &&
                  (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar72[0xf]) {
                auVar63 = ZEXT3264(auVar77);
                uVar2 = uVar36;
              }
              else {
                auVar44 = vpunpckhwd_avx(auVar44,auVar44);
                auVar44 = vpslld_avx(auVar44,0x1f);
                auVar49._16_16_ = auVar44;
                auVar49._0_16_ = auVar54;
                auVar61._8_4_ = 0x7f800000;
                auVar61._0_8_ = 0x7f8000007f800000;
                auVar61._12_4_ = 0x7f800000;
                auVar61._16_4_ = 0x7f800000;
                auVar61._20_4_ = 0x7f800000;
                auVar61._24_4_ = 0x7f800000;
                auVar61._28_4_ = 0x7f800000;
                auVar94 = vblendvps_avx(auVar61,auVar96._0_32_,auVar49);
                auVar63 = ZEXT3264(auVar94);
                if (uVar36 != 8) {
                  *puVar37 = uVar36;
                  puVar37 = puVar37 + 1;
                  local_5ce0._0_8_ = auVar77._0_8_;
                  local_5ce0._8_8_ = auVar77._8_8_;
                  uStack_5cd0 = auVar77._16_8_;
                  uStack_5cc8 = auVar77._24_8_;
                  *(undefined8 *)*pauVar39 = local_5ce0._0_8_;
                  *(undefined8 *)(*pauVar39 + 8) = local_5ce0._8_8_;
                  *(undefined8 *)(*pauVar39 + 0x10) = uStack_5cd0;
                  *(undefined8 *)(*pauVar39 + 0x18) = uStack_5cc8;
                  pauVar39 = pauVar39 + 1;
                }
              }
              uVar36 = uVar2;
              lVar38 = lVar38 + 4;
              auVar45 = auVar63._0_32_;
              _local_5ce0 = auVar77;
            } while (lVar38 != 0);
            if (uVar36 == 8) goto LAB_0043f5da;
            auVar77 = vcmpps_avx(local_5ac0,auVar63._0_32_,6);
            uVar32 = vmovmskps_avx(auVar77);
            root.ptr = uVar36;
          } while ((byte)uVar35 < (byte)POPCOUNT(uVar32));
          *puVar37 = uVar36;
          puVar37 = puVar37 + 1;
          *pauVar39 = auVar63._0_32_;
          pauVar39 = pauVar39 + 1;
        }
        else {
          local_5cc0 = (undefined1  [8])CONCAT44(0,POPCOUNT(uVar32));
          _local_5ca0 = auVar77;
          while (pRVar33 != (RTCIntersectArguments *)0x0) {
            local_5ce0._0_8_ = pRVar33;
            sVar1 = 0;
            if (pRVar33 != (RTCIntersectArguments *)0x0) {
              for (; ((ulong)pRVar33 >> sVar1 & 1) == 0; sVar1 = sVar1 + 1) {
              }
            }
            local_5c80._0_8_ = sVar1;
            auVar78 = ZEXT1664(auVar78._0_16_);
            auVar96 = ZEXT1664(auVar96._0_16_);
            auVar141 = ZEXT1664(auVar141._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar29 = occluded1(This,local_5cf0,root,sVar1,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5c60.field_0,context);
            auVar44 = auVar78._0_16_;
            if (bVar29) {
              *(undefined4 *)(local_5d20 + local_5c80._0_8_ * 4) = 0xffffffff;
            }
            pRVar33 = (RTCIntersectArguments *)(local_5ce0._0_8_ & local_5ce0._0_8_ - 1);
          }
          auVar44 = vpcmpeqd_avx(auVar44,auVar44);
          auVar72 = vpcmpgtd_avx(stack0xffffffffffffa2f0,auVar44);
          auVar44 = vpcmpgtd_avx(local_5d20._0_16_,auVar44);
          auVar78 = ZEXT1664(auVar44);
          auVar44 = vpor_avx(auVar44,auVar72);
          iVar30 = 3;
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            auVar77._8_4_ = 0xff800000;
            auVar77._0_8_ = 0xff800000ff800000;
            auVar77._12_4_ = 0xff800000;
            auVar77._16_4_ = 0xff800000;
            auVar77._20_4_ = 0xff800000;
            auVar77._24_4_ = 0xff800000;
            auVar77._28_4_ = 0xff800000;
            auVar78 = ZEXT3264(auVar77);
            local_5ac0 = vblendvps_avx(local_5ac0,auVar77,_local_5d20);
            iVar30 = 2;
          }
          auVar63 = ZEXT3264(_local_5ca0);
          pRVar33 = (RTCIntersectArguments *)0x0;
          if ((uint)uVar35 < (uint)local_5cc0._0_4_) goto LAB_0043ee90;
        }
LAB_0043f5da:
        pRVar33 = (RTCIntersectArguments *)0x0;
      } while (iVar30 != 3);
LAB_0043f82e:
      auVar77 = vandps_avx(local_5aa0,_local_5d20);
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      auVar62._16_4_ = 0xff800000;
      auVar62._20_4_ = 0xff800000;
      auVar62._24_4_ = 0xff800000;
      auVar62._28_4_ = 0xff800000;
      auVar77 = vmaskmovps_avx(auVar77,auVar62);
      *(undefined1 (*) [32])local_5ce8 = auVar77;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }